

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O2

void __thiscall libcellml::ImportedEntity::ImportedEntity(ImportedEntity *this)

{
  ImportedEntityImpl *pIVar1;
  
  this->_vptr_ImportedEntity = (_func_int **)&PTR___cxa_pure_virtual_0029fdf0;
  pIVar1 = (ImportedEntityImpl *)operator_new(0x30);
  (pIVar1->mImportReference)._M_dataplus._M_p = (pointer)0x0;
  (pIVar1->mImportReference)._M_string_length = 0;
  (pIVar1->mImportReference).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pIVar1->mImportReference).field_2 + 8) = 0;
  (pIVar1->mImportSource).super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (pIVar1->mImportSource).super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pIVar1->mImportReference)._M_dataplus._M_p = (pointer)&(pIVar1->mImportReference).field_2;
  (pIVar1->mImportReference).field_2._M_local_buf[0] = '\0';
  this->mPimpl = pIVar1;
  return;
}

Assistant:

ImportedEntity::ImportedEntity()
    : mPimpl(new ImportedEntityImpl())
{
}